

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaConstructionCtxtFree(xmlSchemaConstructionCtxtPtr con)

{
  xmlSchemaItemListPtr pxVar1;
  xmlSchemaRedefPtr pxVar2;
  xmlSchemaRedefPtr_conflict pxVar3;
  
  pxVar1 = con->buckets;
  if (pxVar1 != (xmlSchemaItemListPtr)0x0) {
    if (pxVar1->items != (void **)0x0) {
      (*xmlFree)(pxVar1->items);
    }
    (*xmlFree)(pxVar1);
  }
  pxVar1 = con->pending;
  if (pxVar1 != (xmlSchemaItemListPtr)0x0) {
    if (pxVar1->items != (void **)0x0) {
      (*xmlFree)(pxVar1->items);
    }
    (*xmlFree)(pxVar1);
  }
  if (con->substGroups != (xmlHashTablePtr)0x0) {
    xmlHashFree(con->substGroups,xmlSchemaSubstGroupFreeEntry);
  }
  pxVar3 = con->redefs;
  while (pxVar3 != (xmlSchemaRedefPtr_conflict)0x0) {
    pxVar2 = pxVar3->next;
    (*xmlFree)(pxVar3);
    pxVar3 = pxVar2;
  }
  if (con->dict != (xmlDictPtr)0x0) {
    xmlDictFree(con->dict);
  }
  (*xmlFree)(con);
  return;
}

Assistant:

static void
xmlSchemaConstructionCtxtFree(xmlSchemaConstructionCtxtPtr con)
{
    /*
    * After the construction context has been freed, there will be
    * no schema graph available any more. Only the schema buckets
    * will stay alive, which are put into the "schemasImports" and
    * "includes" slots of the xmlSchema.
    */
    if (con->buckets != NULL)
	xmlSchemaItemListFree(con->buckets);
    if (con->pending != NULL)
	xmlSchemaItemListFree(con->pending);
    if (con->substGroups != NULL)
	xmlHashFree(con->substGroups, xmlSchemaSubstGroupFreeEntry);
    if (con->redefs != NULL)
	xmlSchemaRedefListFree(con->redefs);
    if (con->dict != NULL)
	xmlDictFree(con->dict);
    xmlFree(con);
}